

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int COVER_map_init(COVER_map_t *map,U32 size)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  long *in_RDI;
  uint local_4;
  
  uVar2 = ZSTD_highbit32(0);
  *(uint *)(in_RDI + 1) = uVar2 + 2;
  *(int *)((long)in_RDI + 0xc) = 1 << ((byte)(int)in_RDI[1] & 0x1f);
  *(int *)(in_RDI + 2) = *(int *)((long)in_RDI + 0xc) + -1;
  pvVar3 = malloc((ulong)*(uint *)((long)in_RDI + 0xc) << 3);
  *in_RDI = (long)pvVar3;
  lVar1 = *in_RDI;
  if (lVar1 != 0) {
    COVER_map_clear((COVER_map_t *)0x2fd254);
  }
  else {
    *(undefined4 *)(in_RDI + 1) = 0;
    *(undefined4 *)((long)in_RDI + 0xc) = 0;
  }
  local_4 = (uint)(lVar1 != 0);
  return local_4;
}

Assistant:

static int COVER_map_init(COVER_map_t *map, U32 size) {
  map->sizeLog = ZSTD_highbit32(size) + 2;
  map->size = (U32)1 << map->sizeLog;
  map->sizeMask = map->size - 1;
  map->data = (COVER_map_pair_t *)malloc(map->size * sizeof(COVER_map_pair_t));
  if (!map->data) {
    map->sizeLog = 0;
    map->size = 0;
    return 0;
  }
  COVER_map_clear(map);
  return 1;
}